

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.h
# Opt level: O3

void __thiscall
SortedList<MessageQueue::ListEntry>::~SortedList(SortedList<MessageQueue::ListEntry> *this)

{
  DListNode<MessageQueue::ListEntry> *pDVar1;
  SortedList<MessageQueue::ListEntry> SVar2;
  DListNode<MessageQueue::ListEntry> **ppDVar3;
  DListNode<MessageQueue::ListEntry> *pDVar4;
  
  pDVar4 = this->head;
  while (pDVar4 != (DListNode<MessageQueue::ListEntry> *)0x0) {
    pDVar1 = pDVar4->prev;
    SVar2.head = pDVar4->next;
    ppDVar3 = &pDVar1->next;
    if (pDVar1 == (DListNode<MessageQueue::ListEntry> *)0x0) {
      ppDVar3 = &this->head;
    }
    *ppDVar3 = SVar2.head;
    if (SVar2.head != (DListNode<MessageQueue::ListEntry> *)0x0) {
      (SVar2.head)->prev = pDVar1;
    }
    operator_delete(pDVar4);
    pDVar4 = this->head;
  }
  return;
}

Assistant:

~SortedList()
    {
        while (head != nullptr)
        {
            Remove(head);
        }
    }